

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::process_req(raft_server *this,req_msg *req,req_ext_params *ext_params)

{
  uint uVar1;
  long lVar2;
  pointer psVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  msg_type type;
  req_ext_params *extraout_RDX;
  req_ext_params *extraout_RDX_00;
  req_ext_params *extraout_RDX_01;
  req_ext_params *extraout_RDX_02;
  req_ext_params *extraout_RDX_03;
  req_ext_params *extraout_RDX_04;
  req_ext_params *extraout_RDX_05;
  req_ext_params *extraout_RDX_06;
  req_ext_params *extraout_RDX_07;
  req_ext_params *extraout_RDX_08;
  req_ext_params *extraout_RDX_09;
  ptr<resp_msg> pVar11;
  Param param;
  msg_type local_84;
  string local_80;
  int local_5c;
  undefined4 local_58 [2];
  undefined4 local_50;
  undefined8 local_48;
  unique_lock<std::recursive_mutex> guard;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  
  local_58[0] = *(undefined4 *)
                 &(req->log_entries_).
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_58[1] = *(undefined4 *)((long)&req->commit_idx_ + 4);
  local_50._0_1_ = true;
  local_50._1_3_ = 0xffffff;
  lVar2 = *(long *)&req[4].super_msg_base.dst_;
  _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ext_params;
  local_48 = ext_params;
  if (*(long *)(lVar2 + 0x80) == 0) {
LAB_001b2a9f:
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00, 4 < iVar9)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_type_to_string_abi_cxx11_
                (&local_80,
                 (nuraft *)
                 (ulong)*(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager,
                 (msg_type)extraout_RDX_00);
      msg_if_given_abi_cxx11_
                ((string *)&param,
                 "Receive a %s message from %d with LastLogIndex=%lu, LastLogTerm %lu, EntriesLength=%zu, CommitIndex=%lu and Term=%lu"
                 ,local_80._M_dataplus._M_p,
                 (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base.
                                         _M_manager + 4),ext_params->context_,
                 ext_params->expected_term_,
                 (long)ext_params[1].after_precommit_.super__Function_base._M_manager -
                 *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8
                          ) >> 4,
                 *(undefined8 *)&ext_params[1].after_precommit_.super__Function_base._M_functor,
                 *(undefined8 *)
                  ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8));
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x296,&param);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
      if ((void **)param._0_8_ != &param.ctx) {
        operator_delete((void *)param._0_8_);
        _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
        _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
      }
    }
    if (((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000000000) == 0) {
      if (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 5) {
        pVar11 = handle_cli_req_prelock(this,req,ext_params);
        _Var10 = pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
        goto LAB_001b3092;
      }
      guard._M_device = (mutex_type *)&req[0xc].last_log_term_;
      guard._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&guard);
      guard._M_owns = true;
      uVar1 = *(uint *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      if ((uVar1 < 0x11) && ((0x1000aU >> (uVar1 & 0x1f) & 1) != 0)) {
        bVar8 = update_term((raft_server *)req,
                            *(ulong *)((long)&(ext_params->after_precommit_).super__Function_base.
                                              _M_functor + 8));
        if (((char)req[4].super_msg_base.term_ == '\0') &&
           (((bVar8 & ((byte)req[2].last_log_term_ ^ 1)) == 1 &&
            (*(int *)&(ext_params->after_precommit_).super__Function_base._M_manager == 1)))) {
          decay_target_priority((raft_server *)req);
        }
        if (0 < *(int *)((long)&req[4].super_msg_base.term_ + 4)) {
          *(undefined4 *)((long)&req[4].super_msg_base.term_ + 4) = 2;
        }
      }
      this->_vptr_raft_server = (_func_int **)0x0;
      (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      iVar9 = *(int *)&(ext_params->after_precommit_).super__Function_base._M_manager;
      if (iVar9 < 0x12) {
        if (iVar9 == 1) {
          handle_vote_req((raft_server *)&param,req);
          uVar7 = param._8_8_;
          uVar6 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar6;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          if (peVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
          }
          goto joined_r0x001b2f8c;
        }
        if (iVar9 != 3) {
LAB_001b2f90:
          handle_ext_msg((raft_server *)&param,req);
          uVar7 = param._8_8_;
          uVar6 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar6;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          if (peVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
          }
          goto joined_r0x001b2f8c;
        }
        param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
        param.myId = *(int32_t *)
                      &(req->log_entries_).
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        param.peerId = *(int32_t *)
                        ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4);
        lVar2 = *(long *)&req[4].super_msg_base.dst_;
        param.ctx = ext_params;
        if (*(long *)(lVar2 + 0x80) != 0) {
          local_84 = 0x15;
          local_80._M_dataplus._M_p = (pointer)&param;
          (**(code **)(lVar2 + 0x88))(lVar2 + 0x70);
        }
        handle_append_entries((raft_server *)&param,req);
        uVar7 = param._8_8_;
        uVar6 = param._0_8_;
        param.myId = 0;
        param.leaderId = 0;
        param.peerId = 0;
        param._12_4_ = 0;
        peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                 super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this->_vptr_raft_server = (_func_int **)uVar6;
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar7;
        if (peVar4 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
        }
        if (param._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param._8_8_);
        }
        param.ctx = this->_vptr_raft_server;
        param.leaderId = *(int32_t *)((long)&req->commit_idx_ + 4);
        param.myId = *(int32_t *)
                      &(req->log_entries_).
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        param.peerId = *(int32_t *)
                        ((long)&(ext_params->after_precommit_).super__Function_base._M_manager + 4);
        lVar2 = *(long *)&req[4].super_msg_base.dst_;
        if (*(long *)(lVar2 + 0x80) != 0) {
          local_84 = 0x16;
          local_80._M_dataplus._M_p = (pointer)&param;
          (**(code **)(lVar2 + 0x88))(lVar2 + 0x70);
        }
      }
      else {
        if (iVar9 == 0x12) {
          psVar3 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((psVar3 != (pointer)0x0) &&
             (iVar9 = (*(code *)(psVar3->
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].buff_.
                                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)(), 3 < iVar9)) {
            psVar3 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)&param,"got ping from %d",
                       (ulong)*(uint *)((long)&(ext_params->after_precommit_).super__Function_base.
                                               _M_manager + 4));
            (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"process_req",0x2cf,&param);
            if ((void **)param._0_8_ != &param.ctx) {
              operator_delete((void *)param._0_8_);
            }
          }
          local_80._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
          local_84 = 0x13;
          local_5c = *(int *)((long)&(ext_params->after_precommit_).super__Function_base._M_manager
                             + 4);
          cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                    ((nuraft *)&param,(unsigned_long *)&local_80,&local_84,(int *)&req->log_entries_
                     ,&local_5c);
          uVar7 = param._8_8_;
          uVar6 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar6;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          if (peVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
          }
        }
        else if (iVar9 == 0x14) {
          handle_prevote_req((raft_server *)&param,req);
          uVar7 = param._8_8_;
          uVar6 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar6;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          if (peVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
          }
        }
        else {
          if (iVar9 != 0x18) goto LAB_001b2f90;
          handle_priority_change_req((raft_server *)&param,req);
          uVar7 = param._8_8_;
          uVar6 = param._0_8_;
          param.myId = 0;
          param.leaderId = 0;
          param.peerId = 0;
          param._12_4_ = 0;
          peVar4 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this->_vptr_raft_server = (_func_int **)uVar6;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          if (peVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
          }
        }
joined_r0x001b2f8c:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param._8_8_);
        }
      }
      if (((this->_vptr_raft_server != (_func_int **)0x0) &&
          (psVar3 = req[9].log_entries_.
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, psVar3 != (pointer)0x0)) &&
         (iVar9 = (*(code *)(psVar3->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)()
         , 4 < iVar9)) {
        psVar3 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_type_to_string_abi_cxx11_
                  (&local_80,(nuraft *)(ulong)*(uint *)(this->_vptr_raft_server + 2),type);
        pp_Var5 = this->_vptr_raft_server;
        msg_if_given_abi_cxx11_
                  ((string *)&param,
                   "Response back a %s message to %d with Accepted=%d, Term=%lu, NextIndex=%lu",
                   local_80._M_dataplus._M_p,(ulong)*(uint *)(pp_Var5 + 3),
                   (ulong)*(byte *)(pp_Var5 + 6),pp_Var5[1],pp_Var5[4]);
        (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"process_req",0x2e4,&param);
        if ((void **)param._0_8_ != &param.ctx) {
          operator_delete((void *)param._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_09;
      goto LAB_001b3092;
    }
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_04, 2 < iVar9)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_((string *)&param,"stopping, return null");
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x29a,&param);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_05;
      if ((void **)param._0_8_ != &param.ctx) goto LAB_001b2c6a;
    }
  }
  else {
    local_80._M_dataplus._M_p._0_4_ = 1;
    param._0_8_ = local_58;
    iVar9 = (**(code **)(lVar2 + 0x88))(lVar2 + 0x70);
    _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (iVar9 != -1) goto LAB_001b2a9f;
    psVar3 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((psVar3 != (pointer)0x0) &&
       (iVar9 = (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
       _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_06, 2 < iVar9)) {
      psVar3 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      msg_if_given_abi_cxx11_((string *)&param,"by callback, return null");
      (*(code *)(psVar3->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar3,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                        ,"process_req",0x28a,&param);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_07;
      if ((void **)param._0_8_ == &param.ctx) goto LAB_001b2c6f;
LAB_001b2c6a:
      operator_delete((void *)param._0_8_);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_08;
    }
  }
LAB_001b2c6f:
  this->_vptr_raft_server = (_func_int **)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001b3092:
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::process_req(req_msg& req,
                                       const req_ext_params& ext_params) {
    cb_func::Param param(id_, leader_);
    param.ctx = &req;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::ProcessReq, &param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, return null");
        return nullptr;
    }

    p_db( "Receive a %s message from %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm %" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 " and Term=%" PRIu64 "",
          msg_type_to_string(req.get_type()).c_str(),
          req.get_src(),
          req.get_last_log_idx(),
          req.get_last_log_term(),
          req.log_entries().size(),
          req.get_commit_idx(),
          req.get_term() );

    if (stopping_) {
        // Shutting down, ignore all incoming messages.
        p_wn("stopping, return null");
        return nullptr;
    }

    if ( req.get_type() == msg_type::client_request ) {
        // Client request doesn't need to go through below process.
        return handle_cli_req_prelock(req, ext_params);
    }

    recur_lock(lock_);
    if ( req.get_type() == msg_type::append_entries_request ||
         req.get_type() == msg_type::request_vote_request ||
         req.get_type() == msg_type::install_snapshot_request ) {
        // we allow the server to be continue after term updated to save a round message
        bool term_updated = update_term(req.get_term());

        if ( !im_learner_ &&
             !hb_alive_ &&
             term_updated &&
             req.get_type() == msg_type::request_vote_request ) {
            // If someone has newer term, that means leader has not been
            // elected in the current term, and this node's election timer
            // has been reset by this request.
            // We should decay the target priority here.
            decay_target_priority();
        }

        // Reset stepping down value to prevent this server goes down when leader
        // crashes after sending a LeaveClusterRequest
        if (steps_to_down_ > 0) {
            steps_to_down_ = 2;
        }
    }

    ptr<resp_msg> resp;
    if (req.get_type() == msg_type::append_entries_request) {
        {
            cb_func::Param param(id_, leader_, req.get_src(), &req);
            ctx_->cb_func_.call(cb_func::ReceivedAppendEntriesReq, &param);
        }
        resp = handle_append_entries(req);
        {
            cb_func::Param param(id_, leader_, req.get_src(), resp.get());
            ctx_->cb_func_.call(cb_func::SentAppendEntriesResp, &param);
        }

    } else if (req.get_type() == msg_type::request_vote_request) {
        resp = handle_vote_req(req);

    } else if (req.get_type() == msg_type::pre_vote_request) {
        resp = handle_prevote_req(req);

    } else if (req.get_type() == msg_type::ping_request) {
        p_in("got ping from %d", req.get_src());
        resp = cs_new<resp_msg>( state_->get_term(),
                                 msg_type::ping_response,
                                 id_,
                                 req.get_src() );

    } else if (req.get_type() == msg_type::priority_change_request) {
        resp = handle_priority_change_req(req);

    } else {
        // extended requests
        resp = handle_ext_msg(req);
    }

    if (resp) {
        p_db( "Response back a %s message to %d with Accepted=%d, "
              "Term=%" PRIu64 ", NextIndex=%" PRIu64 "",
              msg_type_to_string(resp->get_type()).c_str(),
              resp->get_dst(),
              resp->get_accepted() ? 1 : 0,
              resp->get_term(),
              resp->get_next_idx() );
    }

    return resp;
}